

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O2

png_uint_32
png_get_gAMA_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr,png_fixed_point *file_gamma)

{
  png_uint_32 pVar1;
  
  pVar1 = 0;
  if (((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      (file_gamma != (png_fixed_point *)0x0)) && (((info_ptr->colorspace).flags & 1) != 0)) {
    *file_gamma = (info_ptr->colorspace).gamma;
    pVar1 = 1;
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_gAMA_fixed(png_const_structrp png_ptr, png_const_inforp info_ptr,
    png_fixed_point *file_gamma)
{
   png_debug1(1, "in %s retrieval function", "gAMA");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_GAMMA) != 0 &&
       file_gamma != NULL)
   {
      *file_gamma = info_ptr->colorspace.gamma;
      return (PNG_INFO_gAMA);
   }

   return (0);
}